

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O3

Twist * __thiscall
iDynTree::SpatialInertia::applyInverse
          (Twist *__return_storage_ptr__,SpatialInertia *this,SpatialMomentum *mom)

{
  ActualDstType actualDst;
  Matrix<double,_6,_1,_0,_6,_1> velEigen;
  Matrix<double,_6,_1,_0,_6,_1> momEigen;
  Matrix6x6 I;
  Matrix<double,_6,_1,_0,_6,_1> local_338;
  Matrix<double,_6,_1,_0,_6,_1> local_308;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  Matrix<double,_6,_1,_0,_6,_1> local_1b8;
  Scalar local_188 [6];
  undefined1 local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Twist::Twist(__return_storage_ptr__);
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[0];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[1];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.linearVec3.
       super_Vector3.m_data[2];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[0];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[1];
  local_308.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       (mom->super_SpatialForceVector).super_SpatialVector<iDynTree::SpatialForceVector>.angularVec3
       .super_Vector3.m_data[2];
  asMatrix(this);
  local_158 = 0;
  local_2d8 = local_148;
  uStack_2d0 = uStack_140;
  local_2c8 = local_138;
  uStack_2c0 = uStack_130;
  local_2b8 = local_128;
  uStack_2b0 = uStack_120;
  local_2a8 = local_118;
  uStack_2a0 = uStack_110;
  local_298 = local_108;
  uStack_290 = uStack_100;
  local_288 = local_f8;
  uStack_280 = uStack_f0;
  local_278 = local_e8;
  uStack_270 = uStack_e0;
  local_268 = local_d8;
  uStack_260 = uStack_d0;
  local_258 = local_c8;
  uStack_250 = uStack_c0;
  local_248 = local_b8;
  uStack_240 = uStack_b0;
  local_238 = local_a8;
  uStack_230 = uStack_a0;
  local_228 = local_98;
  uStack_220 = uStack_90;
  local_218 = local_88;
  uStack_210 = uStack_80;
  local_208 = local_78;
  uStack_200 = uStack_70;
  local_1f8 = local_68;
  uStack_1f0 = uStack_60;
  local_1e8 = local_58;
  uStack_1e0 = uStack_50;
  local_1d8 = local_48;
  uStack_1d0 = uStack_40;
  local_1c8 = local_38;
  uStack_1c0 = uStack_30;
  Eigen::internal::
  householder_qr_inplace_blocked<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_double,_true>
  ::run((Matrix<double,_6,_6,_1,_6,_6> *)&local_2d8,&local_1b8,0x30,local_188);
  local_158 = 1;
  Eigen::HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>>::
  _solve_impl<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            ((HouseholderQR<Eigen::Matrix<double,6,6,1,6,6>> *)&local_2d8,&local_308,&local_338);
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       local_338.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

Twist SpatialInertia::applyInverse(const SpatialMomentum& mom) const
{
    Twist vel;

    Eigen::Matrix<double,6,1> momEigen = toEigen(mom.asVector());

    Matrix6x6 I = this->asMatrix();
    Eigen::Matrix<double,6,1> velEigen = toEigen(I).householderQr().solve(momEigen);

    toEigen(vel.getLinearVec3()) = velEigen.block<3,1>(0,0);
    toEigen(vel.getAngularVec3()) = velEigen.block<3,1>(3,0);

    return vel;
}